

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O0

aiPropertyStore * aiCreatePropertyStore(void)

{
  PropertyMap *this;
  
  this = (PropertyMap *)operator_new(0xc0);
  memset(this,0,0xc0);
  Assimp::BatchLoader::PropertyMap::PropertyMap(this);
  return (aiPropertyStore *)this;
}

Assistant:

ASSIMP_API aiPropertyStore* aiCreatePropertyStore(void)
{
    return reinterpret_cast<aiPropertyStore*>( new PropertyMap() );
}